

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O3

void ot::commissioner::CommissionerApp::MergeDataset
               (ActiveOperationalDataset *aDst,ActiveOperationalDataset *aSrc)

{
  byte *pbVar1;
  ushort uVar2;
  
  uVar2 = aSrc->mPresentFlags;
  if ((short)uVar2 < 0) {
    aDst->mActiveTimestamp = aSrc->mActiveTimestamp;
    pbVar1 = (byte *)((long)&aDst->mPresentFlags + 1);
    *pbVar1 = *pbVar1 | 0x80;
    uVar2 = aSrc->mPresentFlags;
  }
  if ((uVar2 >> 0xe & 1) != 0) {
    aDst->mChannel = aSrc->mChannel;
    pbVar1 = (byte *)((long)&aDst->mPresentFlags + 1);
    *pbVar1 = *pbVar1 | 0x40;
    uVar2 = aSrc->mPresentFlags;
  }
  if ((uVar2 >> 0xd & 1) != 0) {
    std::
    vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
    ::operator=(&aDst->mChannelMask,&aSrc->mChannelMask);
    pbVar1 = (byte *)((long)&aDst->mPresentFlags + 1);
    *pbVar1 = *pbVar1 | 0x20;
    uVar2 = aSrc->mPresentFlags;
  }
  if ((uVar2 >> 0xc & 1) != 0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&aDst->mExtendedPanId,&aSrc->mExtendedPanId);
    pbVar1 = (byte *)((long)&aDst->mPresentFlags + 1);
    *pbVar1 = *pbVar1 | 0x10;
    uVar2 = aSrc->mPresentFlags;
  }
  if ((uVar2 >> 0xb & 1) != 0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&aDst->mMeshLocalPrefix,&aSrc->mMeshLocalPrefix);
    pbVar1 = (byte *)((long)&aDst->mPresentFlags + 1);
    *pbVar1 = *pbVar1 | 8;
    uVar2 = aSrc->mPresentFlags;
  }
  if ((uVar2 >> 10 & 1) != 0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&aDst->mNetworkMasterKey,&aSrc->mNetworkMasterKey);
    pbVar1 = (byte *)((long)&aDst->mPresentFlags + 1);
    *pbVar1 = *pbVar1 | 4;
    uVar2 = aSrc->mPresentFlags;
  }
  if ((uVar2 >> 9 & 1) != 0) {
    std::__cxx11::string::_M_assign((string *)&aDst->mNetworkName);
    pbVar1 = (byte *)((long)&aDst->mPresentFlags + 1);
    *pbVar1 = *pbVar1 | 2;
    uVar2 = aSrc->mPresentFlags;
  }
  if ((uVar2 >> 8 & 1) != 0) {
    aDst->mPanId = aSrc->mPanId;
    pbVar1 = (byte *)((long)&aDst->mPresentFlags + 1);
    *pbVar1 = *pbVar1 | 1;
    uVar2 = aSrc->mPresentFlags;
  }
  if ((char)uVar2 < '\0') {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&aDst->mPSKc,&aSrc->mPSKc)
    ;
    *(byte *)&aDst->mPresentFlags = (byte)aDst->mPresentFlags | 0x80;
    uVar2 = aSrc->mPresentFlags;
  }
  if ((uVar2 & 0x40) != 0) {
    (aDst->mSecurityPolicy).mRotationTime = (aSrc->mSecurityPolicy).mRotationTime;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&(aDst->mSecurityPolicy).mFlags,&(aSrc->mSecurityPolicy).mFlags);
    *(byte *)&aDst->mPresentFlags = (byte)aDst->mPresentFlags | 0x40;
  }
  return;
}

Assistant:

void CommissionerApp::MergeDataset(ActiveOperationalDataset &aDst, const ActiveOperationalDataset &aSrc)
{
#define SET_IF_PRESENT(name)                                          \
    if (aSrc.mPresentFlags & ActiveOperationalDataset::k##name##Bit)  \
    {                                                                 \
        aDst.m##name = aSrc.m##name;                                  \
        aDst.mPresentFlags |= ActiveOperationalDataset::k##name##Bit; \
    }

    SET_IF_PRESENT(ActiveTimestamp);
    SET_IF_PRESENT(Channel);
    SET_IF_PRESENT(ChannelMask);
    SET_IF_PRESENT(ExtendedPanId);
    SET_IF_PRESENT(MeshLocalPrefix);
    SET_IF_PRESENT(NetworkMasterKey);
    SET_IF_PRESENT(NetworkName);
    SET_IF_PRESENT(PanId);
    SET_IF_PRESENT(PSKc);
    SET_IF_PRESENT(SecurityPolicy);

#undef SET_IF_PRESENT
}